

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[11],kj::StringPtr&,char_const(&)[5]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [11],StringPtr *params_1,
          char (*params_2) [5])

{
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_30 = toCharSequence<char_const(&)[11]>((char (*) [11])this);
  local_40.ptr = *(char **)*params;
  local_40.size_ = *(long *)(*params + 8) - 1;
  local_50 = toCharSequence<char_const(&)[5]>((char (*) [5])params_1);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_30,&local_40,&local_50,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}